

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O0

int vec_expand_(char **data,int *length,int *capacity,int memsz,char *alloc_category)

{
  char *pcVar1;
  int local_48;
  int n;
  void *ptr;
  char *alloc_category_local;
  int memsz_local;
  int *capacity_local;
  int *length_local;
  char **data_local;
  
  if (*capacity < *length + 1) {
    if (*capacity == 0) {
      local_48 = 1;
    }
    else {
      local_48 = *capacity << 1;
    }
    pcVar1 = (char *)golf_realloc_tracked(*data,(long)(local_48 * memsz),alloc_category);
    if (pcVar1 == (char *)0x0) {
      return -1;
    }
    *data = pcVar1;
    *capacity = local_48;
  }
  return 0;
}

Assistant:

int vec_expand_(char **data, int *length, int *capacity, int memsz, const char *alloc_category) {
  if (*length + 1 > *capacity) {
    void *ptr;
    int n = (*capacity == 0) ? 1 : *capacity << 1;
    ptr = golf_realloc_tracked(*data, n * memsz, alloc_category);
    if (ptr == NULL) return -1;
    *data = ptr;
    *capacity = n;
  }
  return 0;
}